

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>::Maybe
          (Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *this,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *other)

{
  NullableValue<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *other_00;
  Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *other_local;
  Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *this_local;
  
  other_00 = mv<kj::_::NullableValue<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>(&other->ptr);
  kj::_::NullableValue<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>::NullableValue
            (&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }